

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

void Fraig_ManMarkRealFanouts(Fraig_Man_t *p)

{
  uint uVar1;
  Fraig_NodeVec_t *p_00;
  ulong uVar2;
  int local_24;
  int i;
  Fraig_Node_t *pNodeR;
  Fraig_NodeVec_t *vNodes;
  Fraig_Man_t *p_local;
  
  p_00 = Fraig_Dfs(p,0);
  for (local_24 = 0; local_24 < p_00->nSize; local_24 = local_24 + 1) {
    *(uint *)&p_00->pArray[local_24]->field_0x18 =
         *(uint *)&p_00->pArray[local_24]->field_0x18 & 0xfffff3ff;
    p_00->pArray[local_24]->pData0 = (Fraig_Node_t *)0x0;
  }
  for (local_24 = 0; local_24 < p_00->nSize; local_24 = local_24 + 1) {
    uVar2 = (ulong)p_00->pArray[local_24]->p1 & 0xfffffffffffffffe;
    if (uVar2 != 0) {
      uVar1 = (*(uint *)(uVar2 + 0x18) >> 10 & 3) + 1 & 3;
      *(uint *)(uVar2 + 0x18) = *(uint *)(uVar2 + 0x18) & 0xfffff3ff | uVar1 << 10;
      if (uVar1 == 3) {
        *(uint *)(uVar2 + 0x18) = *(uint *)(uVar2 + 0x18) & 0xfffff3ff | 0x800;
      }
    }
    uVar2 = (ulong)p_00->pArray[local_24]->p2 & 0xfffffffffffffffe;
    if (uVar2 != 0) {
      uVar1 = (*(uint *)(uVar2 + 0x18) >> 10 & 3) + 1 & 3;
      *(uint *)(uVar2 + 0x18) = *(uint *)(uVar2 + 0x18) & 0xfffff3ff | uVar1 << 10;
      if (uVar1 == 3) {
        *(uint *)(uVar2 + 0x18) = *(uint *)(uVar2 + 0x18) & 0xfffff3ff | 0x800;
      }
    }
  }
  Fraig_NodeVecFree(p_00);
  return;
}

Assistant:

void Fraig_ManMarkRealFanouts( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vNodes;
    Fraig_Node_t * pNodeR;
    int i;
    // collect the nodes reachable
    vNodes = Fraig_Dfs( p, 0 );
    // clean the fanouts field
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        vNodes->pArray[i]->nFanouts = 0;
        vNodes->pArray[i]->pData0 = NULL;
    }
    // mark reachable nodes by setting the two-bit counter pNode->nFans
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p1);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p2);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
    }
    Fraig_NodeVecFree( vNodes );
}